

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

int Abc_SopIsAndType(char *pSop)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  
  uVar1 = 0;
  if ((pSop != (char *)0x0) && (cVar3 = *pSop, cVar3 != '\0')) {
    pcVar2 = pSop + 1;
    iVar4 = 0;
    cVar5 = cVar3;
    do {
      iVar4 = iVar4 + (uint)(cVar5 == '\n');
      cVar5 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar5 != '\0');
    uVar1 = 0;
    if (iVar4 == 1) {
      while (pSop = pSop + 1, cVar3 != ' ') {
        if (cVar3 == '-') {
          return 0;
        }
        cVar3 = *pSop;
      }
      uVar1 = (uint)(*pSop == '1');
    }
  }
  return uVar1;
}

Assistant:

int Abc_SopIsAndType( char * pSop )
{
    char * pCur;
    if ( Abc_SopGetCubeNum(pSop) != 1 )
        return 0;
    for ( pCur = pSop; *pCur != ' '; pCur++ )
        if ( *pCur == '-' )
            return 0;
    if ( pCur[1] != '1' )
        return 0;
    return 1;
}